

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

string * __thiscall
duckdb::StrpTimeFormat::ParseResult::FormatError
          (string *__return_storage_ptr__,ParseResult *this,string_t input,string *format_specifier)

{
  pointer pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  long local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_100[0] = local_f0;
  local_e0 = input.value._0_8_;
  local_d8 = input.value._8_8_;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,
             "Could not parse string \"%s\" according to format specifier \"%s\"\n%s\nError: %s","")
  ;
  lVar2 = input.value._8_8_;
  if (input.value._0_4_ < 0xd) {
    lVar2 = (long)&local_e0 + 4;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,lVar2,(input.value._0_8_ & 0xffffffff) + lVar2);
  pcVar1 = (format_specifier->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + format_specifier->_M_string_length);
  lVar2 = (long)&local_e0 + 4;
  if (0xc < (local_e0 & 0xffffffff)) {
    lVar2 = local_d8;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,lVar2,(local_e0 & 0xffffffff) + lVar2);
  FormatStrpTimeError(&local_50,&local_b0,(optional_idx)(this->error_position).index);
  pcVar1 = (this->error_message)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + (this->error_message)._M_string_length);
  StringUtil::
  Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_100,&local_70,&local_90,&local_50,&local_d0,
             in_stack_fffffffffffffef8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string StrpTimeFormat::ParseResult::FormatError(string_t input, const string &format_specifier) {
	return StringUtil::Format("Could not parse string \"%s\" according to format specifier \"%s\"\n%s\nError: %s",
	                          input.GetString(), format_specifier,
	                          FormatStrpTimeError(input.GetString(), error_position), error_message);
}